

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O0

void check_file_type(FileReader data,char *file_in,MppCodingType type)

{
  char *pcVar1;
  uint local_30;
  uint local_2c;
  undefined8 *puStack_28;
  RK_U32 buf_size;
  FileReaderImpl *impl;
  char *pcStack_18;
  MppCodingType type_local;
  char *file_in_local;
  FileReader data_local;
  
  puStack_28 = (undefined8 *)data;
  impl._4_4_ = type;
  pcStack_18 = file_in;
  file_in_local = (char *)data;
  pcVar1 = strstr(file_in,".ivf");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = strstr(pcStack_18,".jpg");
    if ((((pcVar1 == (char *)0x0) && (pcVar1 = strstr(pcStack_18,".jpeg"), pcVar1 == (char *)0x0))
        && (pcVar1 = strstr(pcStack_18,".mjpeg"), pcVar1 == (char *)0x0)) &&
       (impl._4_4_ != MPP_VIDEO_CodingMJPEG)) {
      local_2c = 0;
      mpp_env_get_u32("reader_buf_size",&local_2c,0x1000);
      if (local_2c < 0x1001) {
        local_30 = 0x1000;
      }
      else {
        local_30 = local_2c;
      }
      *(undefined4 *)((long)puStack_28 + 0x14) = 0;
      puStack_28[4] = (ulong)(local_30 + 0xfff & 0xfffff000);
      puStack_28[5] = 0x100;
      *(undefined4 *)(puStack_28 + 6) = 0;
      puStack_28[7] = read_normal_file;
      *(undefined4 *)((long)puStack_28 + 100) = 0x400;
    }
    else {
      *(undefined4 *)((long)puStack_28 + 0x14) = 1;
      puStack_28[4] = puStack_28[1];
      puStack_28[5] = 0;
      *(undefined4 *)(puStack_28 + 6) = 0;
      puStack_28[7] = read_jpeg_file;
      *(undefined4 *)((long)puStack_28 + 100) = 1;
      mpp_buffer_group_get(puStack_28 + 10,1,0,"mpi_dec_utils","check_file_type");
      if ((puStack_28[10] == 0) &&
         (_mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"impl->group",
                     "check_file_type",0xe1), (_mpp_debug & 0x10000000) != 0)) {
        abort();
      }
    }
  }
  else {
    *(undefined4 *)((long)puStack_28 + 0x14) = 2;
    puStack_28[4] = 0;
    puStack_28[5] = 0;
    *(undefined4 *)(puStack_28 + 6) = 0x20;
    puStack_28[7] = read_ivf_file;
    *(undefined4 *)((long)puStack_28 + 100) = 0x400;
    fseek((FILE *)*puStack_28,(long)*(int *)(puStack_28 + 6),0);
    puStack_28[8] = (long)*(int *)(puStack_28 + 6);
  }
  return;
}

Assistant:

static void check_file_type(FileReader data, char *file_in, MppCodingType type)
{
    FileReaderImpl *impl = (FileReaderImpl*)data;

    if (strstr(file_in, ".ivf")) {
        impl->file_type     = FILE_IVF_TYPE;
        impl->buf_size      = 0;
        impl->stuff_size    = 0;
        impl->seek_base     = IVF_HEADER_LENGTH;
        impl->read_func     = read_ivf_file;
        impl->slot_max      = 1024;     /* preset 1024 file slots */

        fseek(impl->fp_input, impl->seek_base, SEEK_SET);
        impl->read_total = impl->seek_base;
    } else if (strstr(file_in, ".jpg") ||
               strstr(file_in, ".jpeg") ||
               strstr(file_in, ".mjpeg") ||
               type == MPP_VIDEO_CodingMJPEG) {
        impl->file_type     = FILE_JPEG_TYPE;
        impl->buf_size      = impl->file_size;
        impl->stuff_size    = 0;
        impl->seek_base     = 0;
        impl->read_func     = read_jpeg_file;
        impl->slot_max      = 1;
        mpp_buffer_group_get_internal(&impl->group, MPP_BUFFER_TYPE_ION);
        mpp_assert(impl->group);
    } else {
        RK_U32 buf_size = 0;

        mpp_env_get_u32("reader_buf_size", &buf_size, DEFAULT_PACKET_SIZE);

        buf_size = MPP_MAX(buf_size, SZ_4K);
        buf_size = MPP_ALIGN(buf_size, SZ_4K);

        impl->file_type     = FILE_NORMAL_TYPE;
        impl->buf_size      = buf_size;
        impl->stuff_size    = 256;
        impl->seek_base     = 0;
        impl->read_func     = read_normal_file;
        impl->slot_max      = 1024;     /* preset 1024 file slots */
    }
}